

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp9d_api.c
# Opt level: O3

MPP_RET vp9d_prepare(void *ctx,MppPacket pkt,HalDecTask *task)

{
  SplitContext_t_conflict *ctx_00;
  MppPacket s;
  RK_S64 v;
  RK_U32 RVar1;
  RK_S32 RVar2;
  RK_U8 *data;
  size_t sVar3;
  RK_S32 out_size;
  RK_U8 *out_data;
  RK_S32 local_4c;
  RK_U8 *local_48;
  RK_S64 local_40;
  RK_S64 local_38;
  
  ctx_00 = *(SplitContext_t_conflict **)((long)ctx + 8);
  local_48 = (RK_U8 *)0x0;
  local_4c = -1;
  task->valid = 0xffffffff;
  local_38 = mpp_packet_get_pts(pkt);
  local_40 = mpp_packet_get_dts(pkt);
  RVar1 = mpp_packet_get_eos(pkt);
  *(RK_U32 *)((long)ctx + 0x4ca4) = RVar1;
  data = (RK_U8 *)mpp_packet_get_pos(pkt);
  sVar3 = mpp_packet_get_length(pkt);
  RVar2 = vp9d_split_frame(ctx_00,&local_48,&local_4c,data,(RK_S32)sVar3);
  v = local_38;
  if (RVar2 < 0) {
    RVar2 = (RK_S32)sVar3;
  }
  mpp_packet_set_pos(pkt,data + RVar2);
  if (((byte)vp9d_debug & 0x10) != 0) {
    _mpp_log_l(4,"vp9d_api","pkt_len=%d, pts=%lld\n",(char *)0x0,sVar3 & 0xffffffff,v);
  }
  if (local_4c < 1) {
    task->valid = 0;
  }
  else {
    vp9d_get_frame_stream((Vp9CodecContext *)ctx,local_48,local_4c);
    s = *(MppPacket *)((long)ctx + 0x30);
    task->input_packet = s;
    task->valid = 1;
    mpp_packet_set_pts(s,v);
    mpp_packet_set_dts(*(MppPacket *)((long)ctx + 0x30),local_40);
  }
  (task->flags).val =
       (task->flags).val & 0xfffffffffffffffe | (ulong)(*(uint *)((long)ctx + 0x4ca4) & 1);
  return MPP_OK;
}

Assistant:

MPP_RET vp9d_prepare(void *ctx, MppPacket pkt, HalDecTask *task)
{
    MPP_RET ret = MPP_OK;
    Vp9CodecContext *vp9_ctx = (Vp9CodecContext *)ctx;
    SplitContext_t *ps = (SplitContext_t *)vp9_ctx->priv_data2;
    RK_S64 pts = -1;
    RK_S64 dts = -1;
    RK_U8 *buf = NULL;
    RK_S32 length = 0;
    RK_U8 *out_data = NULL;
    RK_S32 out_size = -1;
    RK_S32 consumed = 0;
    RK_U8 *pos = NULL;
    task->valid = -1;

    pts = mpp_packet_get_pts(pkt);
    dts = mpp_packet_get_dts(pkt);
    vp9_ctx->eos = mpp_packet_get_eos(pkt);
    buf = pos = mpp_packet_get_pos(pkt);
    length = (RK_S32)mpp_packet_get_length(pkt);

    consumed = vp9d_split_frame(ps, &out_data, &out_size, buf, length);
    pos += (consumed >= 0) ? consumed : length;

    mpp_packet_set_pos(pkt, pos);
    vp9d_dbg(VP9D_DBG_STRMIN, "pkt_len=%d, pts=%lld\n", length, pts);
    if (out_size > 0) {
        vp9d_get_frame_stream(vp9_ctx, out_data, out_size);
        task->input_packet = vp9_ctx->pkt;
        task->valid = 1;
        mpp_packet_set_pts(vp9_ctx->pkt, pts);
        mpp_packet_set_dts(vp9_ctx->pkt, dts);
        task->flags.eos = vp9_ctx->eos;
    } else {
        task->valid = 0;
        task->flags.eos = vp9_ctx->eos;
    }

    (void)pts;
    (void)dts;
    (void)task;
    return ret = MPP_OK;
}